

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O2

void __thiscall
duckdb::AggregateFunction::AggregateFunction(AggregateFunction *this,AggregateFunction *param_1)

{
  long lVar1;
  aggregate_size_t *pp_Var2;
  aggregate_size_t *pp_Var3;
  byte bVar4;
  
  bVar4 = 0;
  BaseScalarFunction::BaseScalarFunction
            (&this->super_BaseScalarFunction,&param_1->super_BaseScalarFunction);
  *(undefined ***)this = &PTR__AggregateFunction_00571f10;
  pp_Var2 = &param_1->state_size;
  pp_Var3 = &this->state_size;
  for (lVar1 = 0x6a; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)pp_Var3 = *(undefined1 *)pp_Var2;
    pp_Var2 = (aggregate_size_t *)((long)pp_Var2 + (ulong)bVar4 * -2 + 1);
    pp_Var3 = (aggregate_size_t *)((long)pp_Var3 + (ulong)bVar4 * -2 + 1);
  }
  std::__shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2> *)
             &this->function_info,
             (__shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2> *)
             &param_1->function_info);
  return;
}

Assistant:

AggregateFunction(const string &name, const vector<LogicalType> &arguments, const LogicalType &return_type,
	                  aggregate_size_t state_size, aggregate_initialize_t initialize, aggregate_update_t update,
	                  aggregate_combine_t combine, aggregate_finalize_t finalize,
	                  FunctionNullHandling null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING,
	                  aggregate_simple_update_t simple_update = nullptr, bind_aggregate_function_t bind = nullptr,
	                  aggregate_destructor_t destructor = nullptr, aggregate_statistics_t statistics = nullptr,
	                  aggregate_window_t window = nullptr, aggregate_serialize_t serialize = nullptr,
	                  aggregate_deserialize_t deserialize = nullptr)
	    : BaseScalarFunction(name, arguments, return_type, FunctionStability::CONSISTENT,
	                         LogicalType(LogicalTypeId::INVALID), null_handling),
	      state_size(state_size), initialize(initialize), update(update), combine(combine), finalize(finalize),
	      simple_update(simple_update), window(window), bind(bind), destructor(destructor), statistics(statistics),
	      serialize(serialize), deserialize(deserialize), order_dependent(AggregateOrderDependent::ORDER_DEPENDENT),
	      distinct_dependent(AggregateDistinctDependent::DISTINCT_DEPENDENT) {
	}